

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O0

void __thiscall
GenericModelItem::sortChildren
          (GenericModelItem *this,int column,int role,SortOrder order,bool recursive,
          QModelIndexList *persistentIndexes,QVector<RolesContainer> *headersToSort)

{
  qsizetype *pqVar1;
  int iVar2;
  bool bVar3;
  qsizetype qVar4;
  const_reference ppGVar5;
  iterator iVar6;
  iterator iVar7;
  const_reference pQVar8;
  reference this_00;
  QModelIndex local_170;
  undefined1 local_158 [8];
  QModelIndex fromIdx;
  GenericModelItem *iChild;
  int i_2;
  int fromRow;
  GenericModelItem *columnChild_1;
  int maxRow;
  int toRow;
  QModelIndexList changedPersistentIndexesTo;
  QModelIndexList changedPersistentIndexesFrom;
  QVector<GenericModelItem_*> newChildren;
  QList<QMap<int,_QVariant>_> local_d0;
  undefined1 local_b8 [8];
  QVector<RolesContainer> updatedHeadersToSort;
  anon_class_4_1_89912d74 greaterComparison;
  anon_class_4_1_89912d74 lessComparison;
  GenericModelItem *columnChild;
  int local_58;
  int maxI_1;
  int i_1;
  undefined1 local_48 [8];
  QVector<GenericModelItem_*> columnChildren;
  int maxI;
  int i;
  QModelIndexList *persistentIndexes_local;
  bool recursive_local;
  SortOrder order_local;
  int role_local;
  int column_local;
  GenericModelItem *this_local;
  
  bVar3 = QList<GenericModelItem_*>::isEmpty(&this->children);
  if ((!bVar3) && (column < this->m_colCount)) {
    if (recursive) {
      columnChildren.d.size._4_4_ = 0;
      qVar4 = QList<GenericModelItem_*>::size(&this->children);
      columnChildren.d.size._0_4_ = (int)qVar4;
      for (; columnChildren.d.size._4_4_ < (int)columnChildren.d.size;
          columnChildren.d.size._4_4_ = columnChildren.d.size._4_4_ + 1) {
        ppGVar5 = QList<GenericModelItem_*>::at(&this->children,(long)columnChildren.d.size._4_4_);
        sortChildren(*ppGVar5,column,role,order,recursive,persistentIndexes,
                     (QVector<RolesContainer> *)0x0);
      }
    }
    QList<GenericModelItem_*>::QList((QList<GenericModelItem_*> *)local_48);
    QList<GenericModelItem_*>::reserve((QList<GenericModelItem_*> *)local_48,(long)this->m_rowCount)
    ;
    qVar4 = QList<GenericModelItem_*>::size(&this->children);
    for (local_58 = column; local_58 < (int)qVar4; local_58 = this->m_colCount + local_58) {
      ppGVar5 = QList<GenericModelItem_*>::at(&this->children,(long)local_58);
      QList<GenericModelItem_*>::append((QList<GenericModelItem_*> *)local_48,*ppGVar5);
    }
    if (order == AscendingOrder) {
      iVar6 = QList<GenericModelItem_*>::begin((QList<GenericModelItem_*> *)local_48);
      iVar7 = QList<GenericModelItem_*>::end((QList<GenericModelItem_*> *)local_48);
      std::
      stable_sort<QList<GenericModelItem*>::iterator,GenericModelItem::sortChildren(int,int,Qt::SortOrder,bool,QList<QModelIndex>const&,QList<QMap<int,QVariant>>*)::__0>
                (iVar6,iVar7,(anon_class_4_1_89912d74)role);
    }
    else {
      iVar6 = QList<GenericModelItem_*>::begin((QList<GenericModelItem_*> *)local_48);
      iVar7 = QList<GenericModelItem_*>::end((QList<GenericModelItem_*> *)local_48);
      updatedHeadersToSort.d.size._4_4_ = role;
      std::
      stable_sort<QList<GenericModelItem*>::iterator,GenericModelItem::sortChildren(int,int,Qt::SortOrder,bool,QList<QModelIndex>const&,QList<QMap<int,QVariant>>*)::__1>
                (iVar6,iVar7,(anon_class_4_1_89912d74)role);
    }
    QList<QMap<int,_QVariant>_>::QList((QList<QMap<int,_QVariant>_> *)local_b8);
    if (headersToSort != (QVector<RolesContainer> *)0x0) {
      qVar4 = QList<QMap<int,_QVariant>_>::size(headersToSort);
      newChildren.d.size = 0;
      pqVar1 = &newChildren.d.size;
      QMap<int,_QVariant>::QMap((QMap<int,_QVariant> *)pqVar1);
      QList<QMap<int,_QVariant>_>::QList(&local_d0,qVar4,(parameter_type)pqVar1);
      QList<QMap<int,_QVariant>_>::operator=((QList<QMap<int,_QVariant>_> *)local_b8,&local_d0);
      QList<QMap<int,_QVariant>_>::~QList(&local_d0);
      QMap<int,_QVariant>::~QMap((QMap<int,_QVariant> *)&newChildren.d.size);
    }
    pqVar1 = &changedPersistentIndexesFrom.d.size;
    QList<GenericModelItem_*>::QList((QList<GenericModelItem_*> *)pqVar1);
    qVar4 = QList<GenericModelItem_*>::size(&this->children);
    QList<GenericModelItem_*>::reserve((QList<GenericModelItem_*> *)pqVar1,qVar4);
    QList<QModelIndex>::QList((QList<QModelIndex> *)&changedPersistentIndexesTo.d.size);
    QList<QModelIndex>::QList((QList<QModelIndex> *)&maxRow);
    columnChild_1._4_4_ = 0;
    qVar4 = QList<GenericModelItem_*>::size((QList<GenericModelItem_*> *)local_48);
    for (; columnChild_1._4_4_ < (int)qVar4; columnChild_1._4_4_ = columnChild_1._4_4_ + 1) {
      ppGVar5 = QList<GenericModelItem_*>::at
                          ((QList<GenericModelItem_*> *)local_48,(long)columnChild_1._4_4_);
      iVar2 = (*ppGVar5)->m_row;
      if (headersToSort != (QVector<RolesContainer> *)0x0) {
        pQVar8 = QList<QMap<int,_QVariant>_>::at(headersToSort,(long)iVar2);
        this_00 = QList<QMap<int,_QVariant>_>::operator[]
                            ((QList<QMap<int,_QVariant>_> *)local_b8,(long)columnChild_1._4_4_);
        QMap<int,_QVariant>::operator=(this_00,pQVar8);
      }
      for (iChild._0_4_ = this->m_colCount * iVar2; (int)iChild < this->m_colCount * (iVar2 + 1);
          iChild._0_4_ = (int)iChild + 1) {
        ppGVar5 = QList<GenericModelItem_*>::at(&this->children,(long)(int)iChild);
        fromIdx.m = (QAbstractItemModel *)*ppGVar5;
        if (columnChild_1._4_4_ != iVar2) {
          QAbstractItemModel::createIndex
                    ((QModelIndex *)local_158,&this->m_model->super_QAbstractItemModel,
                     ((GenericModelItem *)fromIdx.m)->m_row,
                     ((GenericModelItem *)fromIdx.m)->m_column,fromIdx.m);
          bVar3 = QListSpecialMethodsBase<QModelIndex>::contains<QModelIndex>
                            ((QListSpecialMethodsBase<QModelIndex> *)persistentIndexes,
                             (QModelIndex *)local_158);
          if (bVar3) {
            QList<QModelIndex>::append
                      ((QList<QModelIndex> *)&changedPersistentIndexesTo.d.size,
                       (parameter_type)local_158);
            QAbstractItemModel::createIndex
                      (&local_170,&this->m_model->super_QAbstractItemModel,columnChild_1._4_4_,
                       *(int *)(fromIdx.m + 0x28),fromIdx.m);
            QList<QModelIndex>::append((QList<QModelIndex> *)&maxRow,&local_170);
          }
          *(int *)(fromIdx.m + 0x24) = columnChild_1._4_4_;
        }
        QList<GenericModelItem_*>::append
                  ((QList<GenericModelItem_*> *)&changedPersistentIndexesFrom.d.size,
                   (parameter_type)fromIdx.m);
      }
    }
    QList<GenericModelItem_*>::operator=
              (&this->children,(QList<GenericModelItem_*> *)&changedPersistentIndexesFrom.d.size);
    if (headersToSort != (QVector<RolesContainer> *)0x0) {
      QList<QMap<int,_QVariant>_>::operator=(headersToSort,(QList<QMap<int,_QVariant>_> *)local_b8);
    }
    QAbstractItemModel::changePersistentIndexList
              ((QList_conflict2 *)this->m_model,
               (QList_conflict2 *)&changedPersistentIndexesTo.d.size);
    QList<QModelIndex>::~QList((QList<QModelIndex> *)&maxRow);
    QList<QModelIndex>::~QList((QList<QModelIndex> *)&changedPersistentIndexesTo.d.size);
    QList<GenericModelItem_*>::~QList
              ((QList<GenericModelItem_*> *)&changedPersistentIndexesFrom.d.size);
    QList<QMap<int,_QVariant>_>::~QList((QList<QMap<int,_QVariant>_> *)local_b8);
    QList<GenericModelItem_*>::~QList((QList<GenericModelItem_*> *)local_48);
  }
  return;
}

Assistant:

void GenericModelItem::sortChildren(int column, int role, Qt::SortOrder order, bool recursive, const QModelIndexList &persistentIndexes,
                                    QVector<RolesContainer> *headersToSort)
{
    Q_ASSERT(column >= 0);
    if (children.isEmpty() || column >= m_colCount)
        return;
    if (recursive) {
        for (int i = 0, maxI = children.size(); i < maxI; ++i)
            children.at(i)->sortChildren(column, role, order, recursive, persistentIndexes, nullptr);
    }
    QVector<GenericModelItem *> columnChildren;
    columnChildren.reserve(m_rowCount);
    for (int i = column, maxI = children.size(); i < maxI; i += m_colCount) {
        GenericModelItem *columnChild = children.at(i);
        columnChildren.append(columnChild);
    }
    const auto lessComparison = [role](const GenericModelItem *a, const GenericModelItem *b) -> bool {
        return GenericModelPrivate::isVariantLessThan(a->data.value(role), b->data.value(role));
    };
    const auto greaterComparison = [role](const GenericModelItem *a, const GenericModelItem *b) -> bool {
        return GenericModelPrivate::isVariantLessThan(b->data.value(role), a->data.value(role));
    };
    if (order == Qt::AscendingOrder)
        std::stable_sort(columnChildren.begin(), columnChildren.end(), lessComparison);
    else
        std::stable_sort(columnChildren.begin(), columnChildren.end(), greaterComparison);
    QVector<RolesContainer> updatedHeadersToSort;
    if (headersToSort)
        updatedHeadersToSort = QVector<RolesContainer>(headersToSort->size(), RolesContainer());
    QVector<GenericModelItem *> newChildren;
    newChildren.reserve(children.size());
    QModelIndexList changedPersistentIndexesFrom, changedPersistentIndexesTo;
    for (int toRow = 0, maxRow = columnChildren.size(); toRow < maxRow; ++toRow) {
        GenericModelItem *const columnChild = columnChildren.at(toRow);
        const int fromRow = columnChild->m_row;
        if (headersToSort)
            updatedHeadersToSort[toRow] = headersToSort->at(fromRow);
        for (int i = m_colCount * fromRow; i < m_colCount * (fromRow + 1); ++i) {
            GenericModelItem *const iChild = children.at(i);
            if (toRow != fromRow) {
                QModelIndex fromIdx = m_model->createIndex(iChild->m_row, iChild->m_column, iChild);
                if (persistentIndexes.contains(fromIdx)) {
                    changedPersistentIndexesFrom.append(fromIdx);
                    changedPersistentIndexesTo.append(m_model->createIndex(toRow, iChild->m_column, iChild));
                }
                iChild->m_row = toRow;
            }
            newChildren.append(iChild);
        }
    }
    Q_ASSERT(newChildren.size() == children.size());
    Q_ASSERT(std::all_of(newChildren.constBegin(), newChildren.constEnd(), [](const GenericModelItem *a) -> bool { return a != nullptr; }));
    children = newChildren;
    if (headersToSort)
        *headersToSort = updatedHeadersToSort;
    m_model->changePersistentIndexList(changedPersistentIndexesFrom, changedPersistentIndexesTo);
}